

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O0

string * getFileName(string *filePathName,bool getFile)

{
  byte in_DL;
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  string *retStr;
  string local_70 [32];
  string local_50 [48];
  long local_20;
  undefined1 local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  std::__cxx11::string::string(in_RDI,in_RSI);
  local_20 = std::__cxx11::string::rfind((char *)in_RDI,0x12f34f);
  if (local_20 != -1) {
    if ((local_11 & 1) == 0) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)in_RDI);
      std::__cxx11::string::operator=(in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)in_RDI);
      std::__cxx11::string::operator=(in_RDI,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  return in_RDI;
}

Assistant:

inline string getFileName(const string& filePathName, bool getFile) {
  string retStr = filePathName;
  string::size_type pos = retStr.rfind("/");
  if (pos != string::npos) {
    if (getFile) retStr = retStr.substr(pos + 1);
    else retStr = retStr.substr(0, pos);
  }
  return retStr;
}